

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O3

string_type * __thiscall
toml::detail::serializer<toml::type_config>::format_indent_abi_cxx11_
          (string_type *__return_storage_ptr__,serializer<toml::type_config> *this,
          indent_char indent_type)

{
  uint uVar1;
  int iVar2;
  undefined7 in_register_00000011;
  size_type sVar3;
  size_type __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  uVar1 = this->current_indent_;
  __n = 0;
  if (0 < (int)uVar1) {
    __n = (size_type)uVar1;
  }
  iVar2 = (int)CONCAT71(in_register_00000011,indent_type);
  if (iVar2 == 1) {
    if ((int)uVar1 < 1) {
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
    }
    else {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_construct(&local_58,__n,'\t');
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        sVar3 = CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                         local_58.field_2._M_local_buf[0]);
        local_38._M_string_length = local_58._M_string_length;
        local_38._M_dataplus._M_p = local_58._M_dataplus._M_p;
        goto LAB_003e3c19;
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = local_58.field_2._M_local_buf[0];
    *(ulong *)((long)&__return_storage_ptr__->field_2 + 1) =
         CONCAT17(local_58.field_2._M_local_buf[8],local_58.field_2._M_allocated_capacity._1_7_);
    *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 9) = local_58.field_2._9_4_;
    *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 0xd) = local_58.field_2._13_2_;
    local_38._M_string_length = local_58._M_string_length;
    local_38.field_2._M_local_buf[0xf] = local_58.field_2._M_local_buf[0xf];
  }
  else {
    if (iVar2 != 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
    if ((int)uVar1 < 1) {
      local_38._M_string_length = 0;
      local_38.field_2._M_local_buf[0] = '\0';
    }
    else {
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_construct(&local_38,__n,' ');
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        sVar3 = CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                         local_38.field_2._M_local_buf[0]);
LAB_003e3c19:
        (__return_storage_ptr__->_M_dataplus)._M_p = local_38._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = sVar3;
        goto LAB_003e3cbe;
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = local_38.field_2._M_local_buf[0];
    *(ulong *)((long)&__return_storage_ptr__->field_2 + 1) =
         CONCAT17(local_38.field_2._M_local_buf[8],local_38.field_2._M_allocated_capacity._1_7_);
    *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 9) = local_38.field_2._9_4_;
    *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 0xd) = local_38.field_2._13_2_;
  }
  (__return_storage_ptr__->field_2)._M_local_buf[0xf] = local_38.field_2._M_local_buf[0xf];
LAB_003e3cbe:
  __return_storage_ptr__->_M_string_length = local_38._M_string_length;
  return __return_storage_ptr__;
}

Assistant:

string_type format_indent(const indent_char indent_type) const // {{{
    {
        const auto indent = static_cast<std::size_t>((std::max)(0, this->current_indent_));
        if(indent_type == indent_char::space)
        {
            return string_conv<string_type>(make_string(indent, ' '));
        }
        else if(indent_type == indent_char::tab)
        {
            return string_conv<string_type>(make_string(indent, '\t'));
        }
        else
        {
            return string_type{};
        }
    }